

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O3

void __thiscall
absl::lts_20250127::synchronization_internal::GraphCycles::GraphCycles(GraphCycles *this)

{
  uint uVar1;
  Rep *this_00;
  uint uVar2;
  bool bVar3;
  
  if (((anonymous_namespace)::arena_mu & 1) == 0) {
    uVar2 = (anonymous_namespace)::arena_mu | 1;
    LOCK();
    UNLOCK();
    uVar1 = (anonymous_namespace)::arena_mu & 1;
    (anonymous_namespace)::arena_mu = uVar2;
    if (uVar1 == 0) goto LAB_002b69ee;
  }
  base_internal::SpinLock::SlowLock((SpinLock *)&(anonymous_namespace)::arena_mu);
LAB_002b69ee:
  if ((anonymous_namespace)::arena == (Arena *)0x0) {
    (anonymous_namespace)::arena = base_internal::LowLevelAlloc::NewArena(0);
  }
  uVar1 = (anonymous_namespace)::arena_mu;
  uVar2 = (anonymous_namespace)::arena_mu & 2;
  LOCK();
  UNLOCK();
  bVar3 = 7 < (anonymous_namespace)::arena_mu;
  (anonymous_namespace)::arena_mu = uVar2;
  if (bVar3) {
    base_internal::SpinLock::SlowUnlock((SpinLock *)&(anonymous_namespace)::arena_mu,uVar1);
  }
  this_00 = (Rep *)base_internal::LowLevelAlloc::AllocWithArena
                             (0x100168,(anonymous_namespace)::arena);
  Rep::Rep(this_00);
  this->rep_ = this_00;
  return;
}

Assistant:

GraphCycles::GraphCycles() {
  InitArenaIfNecessary();
  rep_ = new (base_internal::LowLevelAlloc::AllocWithArena(sizeof(Rep), arena))
      Rep;
}